

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O3

void __thiscall
duckdb::TemporaryFileCompressionAdaptivity::Update
          (TemporaryFileCompressionAdaptivity *this,TemporaryCompressionLevel level,
          int64_t time_before_ns)

{
  int iVar1;
  long lVar2;
  unsigned_long uVar3;
  long lVar4;
  int64_t *piVar5;
  
  lVar2 = ::std::chrono::_V2::system_clock::now();
  if (level == UNCOMPRESSED) {
    piVar5 = &this->last_uncompressed_write_ns;
  }
  else {
    uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert
                      ((level - (level + ZSTD_FIVE >> 0x1f)) + 5 >> 1);
    piVar5 = this->last_compressed_writes_ns + uVar3;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    lVar4 = (lVar2 - time_before_ns) + *piVar5 * 0xf;
    lVar2 = (lVar2 - time_before_ns) + 0xf + *piVar5 * 0xf;
    if (-1 < lVar4) {
      lVar2 = lVar4;
    }
    *piVar5 = lVar2 >> 4;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void TemporaryFileCompressionAdaptivity::Update(const TemporaryCompressionLevel level, const int64_t time_before_ns) {
	const auto duration = GetCurrentTimeNanos() - time_before_ns;
	auto &last_write_ns = level == TemporaryCompressionLevel::UNCOMPRESSED
	                          ? last_uncompressed_write_ns
	                          : last_compressed_writes_ns[LevelToIndex(level)];
	lock_guard<mutex> guard(random_engine.lock);
	last_write_ns = (last_write_ns * (WEIGHT - 1) + duration) / WEIGHT;
}